

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

int32_t __thiscall
icu_63::SimpleTimeZone::getOffset
          (SimpleTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,uint8_t dayOfWeek
          ,int32_t millis,int32_t monthLength,int32_t prevMonthLength,UErrorCode *status)

{
  char ruleMonth;
  char ruleMonth_00;
  int32_t iVar1;
  uint uVar2;
  int iVar3;
  uint millisDelta;
  
  iVar3 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((((day < 1 || (0xb < (uint)month || 1 < era)) || (prevMonthLength - 0x20U < 0xfffffffc)) ||
         (monthLength - 0x20U < 0xfffffffc)) ||
        ((86399999 < (uint)millis || ((byte)(dayOfWeek - 8) < 0xf9)))) || (monthLength < day)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      iVar3 = -1;
    }
    else {
      iVar3 = this->rawOffset;
      if (((this->useDaylight != '\0') && (era == '\x01')) && (this->startYear <= year)) {
        ruleMonth = this->startMonth;
        ruleMonth_00 = this->endMonth;
        millisDelta = -iVar3;
        uVar2 = 0;
        if (this->startTimeMode == UTC_TIME) {
          uVar2 = millisDelta;
        }
        iVar1 = compareToRule((int8_t)month,(int8_t)monthLength,(int8_t)prevMonthLength,(int8_t)day,
                              dayOfWeek,millis,uVar2,this->startMode,ruleMonth,this->startDayOfWeek,
                              this->startDay,this->startTime);
        uVar2 = 0;
        if (ruleMonth_00 < ruleMonth != -1 < iVar1) {
          if ((this->endTimeMode != UTC_TIME) &&
             (millisDelta = uVar2, this->endTimeMode == WALL_TIME)) {
            millisDelta = this->dstSavings;
          }
          uVar2 = compareToRule((int8_t)month,(int8_t)monthLength,(int8_t)prevMonthLength,
                                (int8_t)day,dayOfWeek,millis,millisDelta,this->endMode,ruleMonth_00,
                                this->endDayOfWeek,this->endDay,this->endTime);
          uVar2 = uVar2 >> 0x1f;
        }
        if ((((ruleMonth <= ruleMonth_00 && -1 < iVar1) & (byte)uVar2) != 0) ||
           ((ruleMonth_00 < ruleMonth & (-1 < iVar1 | (byte)uVar2)) != 0)) {
          iVar3 = iVar3 + this->dstSavings;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int32_t 
SimpleTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                          uint8_t dayOfWeek, int32_t millis, 
                          int32_t monthLength, int32_t prevMonthLength,
                          UErrorCode& status) const
{
    if(U_FAILURE(status)) return 0;

    if ((era != GregorianCalendar::AD && era != GregorianCalendar::BC)
        || month < UCAL_JANUARY
        || month > UCAL_DECEMBER
        || day < 1
        || day > monthLength
        || dayOfWeek < UCAL_SUNDAY
        || dayOfWeek > UCAL_SATURDAY
        || millis < 0
        || millis >= U_MILLIS_PER_DAY
        || monthLength < 28
        || monthLength > 31
        || prevMonthLength < 28
        || prevMonthLength > 31) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }

    int32_t result = rawOffset;

    // Bail out if we are before the onset of daylight savings time
    if(!useDaylight || year < startYear || era != GregorianCalendar::AD) 
        return result;

    // Check for southern hemisphere.  We assume that the start and end
    // month are different.
    UBool southern = (startMonth > endMonth);

    // Compare the date to the starting and ending rules.+1 = date>rule, -1
    // = date<rule, 0 = date==rule.
    int32_t startCompare = compareToRule((int8_t)month, (int8_t)monthLength, (int8_t)prevMonthLength,
                                         (int8_t)day, (int8_t)dayOfWeek, millis,
                                         startTimeMode == UTC_TIME ? -rawOffset : 0,
                                         startMode, (int8_t)startMonth, (int8_t)startDayOfWeek,
                                         (int8_t)startDay, startTime);
    int32_t endCompare = 0;

    /* We don't always have to compute endCompare.  For many instances,
     * startCompare is enough to determine if we are in DST or not.  In the
     * northern hemisphere, if we are before the start rule, we can't have
     * DST.  In the southern hemisphere, if we are after the start rule, we
     * must have DST.  This is reflected in the way the next if statement
     * (not the one immediately following) short circuits. */
    if(southern != (startCompare >= 0)) {
        endCompare = compareToRule((int8_t)month, (int8_t)monthLength, (int8_t)prevMonthLength,
                                   (int8_t)day, (int8_t)dayOfWeek, millis,
                                   endTimeMode == WALL_TIME ? dstSavings :
                                    (endTimeMode == UTC_TIME ? -rawOffset : 0),
                                   endMode, (int8_t)endMonth, (int8_t)endDayOfWeek,
                                   (int8_t)endDay, endTime);
    }

    // Check for both the northern and southern hemisphere cases.  We
    // assume that in the northern hemisphere, the start rule is before the
    // end rule within the calendar year, and vice versa for the southern
    // hemisphere.
    if ((!southern && (startCompare >= 0 && endCompare < 0)) ||
        (southern && (startCompare >= 0 || endCompare < 0)))
        result += dstSavings;

    return result;
}